

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSMSFormat.hpp
# Opt level: O0

Mesh * __thiscall OpenMD::MSMSFormat::ReadShape(MSMSFormat *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  double *pdVar7;
  ostream *poVar8;
  size_type sVar9;
  size_t sVar10;
  long in_RDI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  RealType RVar11;
  int v2;
  int v1;
  int v0;
  StringTokenizer tokenizer_1;
  Vector3d normal;
  Vector3d vertex;
  StringTokenizer tokenizer;
  string line;
  char inbuf [180];
  streamoff in_stack_fffffffffffffc98;
  StringTokenizer *in_stack_fffffffffffffca0;
  Mesh *pMVar12;
  value_type *in_stack_fffffffffffffca8;
  StringTokenizer *in_stack_fffffffffffffcb0;
  StringTokenizer *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  StringTokenizer *in_stack_fffffffffffffce0;
  allocator<char> local_241;
  string local_240 [120];
  Vector3d *in_stack_fffffffffffffe38;
  Vector3d *in_stack_fffffffffffffe40;
  Vector3d *in_stack_fffffffffffffe48;
  Mesh *in_stack_fffffffffffffe50;
  Vector<double,_3U> local_1a0;
  allocator<char> local_181;
  string local_180 [120];
  undefined8 local_108;
  undefined8 local_100;
  string local_e8 [32];
  char local_c8 [200];
  
  std::__cxx11::string::string(local_e8);
  std::ios::clear((int)*(long **)(in_RDI + 0x30) +
                  (int)*(undefined8 *)(**(long **)(in_RDI + 0x30) + -0x18));
  uVar1 = *(undefined8 *)(in_RDI + 0x30);
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::istream::seekg(uVar1,local_108,local_100);
  while( true ) {
    plVar6 = (long *)std::istream::getline(*(char **)(in_RDI + 0x30),(long)local_c8);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if (!bVar2) break;
    if (local_c8[0] != '#') {
      std::__cxx11::string::operator=(local_e8,local_c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffce0->tokenString_,(char *)in_stack_fffffffffffffcd8,
                 (allocator<char> *)in_stack_fffffffffffffcd0);
      StringTokenizer::StringTokenizer
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator(&local_181);
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffffcb0);
      if (2 < iVar3) {
        Vector3<double>::Vector3((Vector3<double> *)0x11d7d2);
        RVar11 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffce0);
        pdVar7 = Vector<double,_3U>::operator[](&local_1a0,0);
        *pdVar7 = RVar11;
        RVar11 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffce0);
        pdVar7 = Vector<double,_3U>::operator[](&local_1a0,1);
        *pdVar7 = RVar11;
        RVar11 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffce0);
        pdVar7 = Vector<double,_3U>::operator[](&local_1a0,2);
        *pdVar7 = RVar11;
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      }
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffffcb0);
      if (5 < iVar3) {
        Vector3<double>::Vector3((Vector3<double> *)0x11d987);
        RVar11 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffce0);
        pdVar7 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xfffffffffffffe48,0);
        *pdVar7 = RVar11;
        RVar11 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffce0);
        pdVar7 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xfffffffffffffe48,1);
        *pdVar7 = RVar11;
        RVar11 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffce0);
        pdVar7 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)&stack0xfffffffffffffe48,2);
        *pdVar7 = RVar11;
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffffca0);
    }
  }
  std::ios::clear((int)*(long **)(in_RDI + 0x28) +
                  (int)*(undefined8 *)(**(long **)(in_RDI + 0x28) + -0x18));
  uVar1 = *(undefined8 *)(in_RDI + 0x28);
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::istream::seekg(uVar1,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40);
  while( true ) {
    plVar6 = (long *)std::istream::getline(*(char **)(in_RDI + 0x28),(long)local_c8);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if (!bVar2) break;
    if (local_c8[0] != '#') {
      std::__cxx11::string::operator=(local_e8,local_c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffce0->tokenString_,(char *)in_stack_fffffffffffffcd8,
                 (allocator<char> *)in_stack_fffffffffffffcd0);
      StringTokenizer::StringTokenizer
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
      iVar3 = StringTokenizer::countTokens(in_stack_fffffffffffffcb0);
      if (2 < iVar3) {
        iVar3 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffcc0);
        iVar4 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffcc0);
        iVar5 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffcc0);
        in_stack_fffffffffffffcd0 = *(string **)(in_RDI + 0x20);
        this_00 = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                  (in_RDI + 0x38);
        in_stack_fffffffffffffcd8 =
             (string *)
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
             operator[](this_00,(long)(iVar3 + -1));
        in_stack_fffffffffffffce0 =
             (StringTokenizer *)
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
             operator[](this_00,(long)(iVar4 + -1));
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (this_00,(long)(iVar5 + -1));
        Mesh::add(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                  in_stack_fffffffffffffe38);
      }
      StringTokenizer::~StringTokenizer(in_stack_fffffffffffffca0);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,"MSMS files have ");
  sVar9 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (in_RDI + 0x38));
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar9);
  std::operator<<(poVar8," vertices and ");
  sVar10 = Mesh::size((Mesh *)0x11ddc9);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,sVar10);
  std::operator<<(poVar8," facets\n");
  pMVar12 = *(Mesh **)(in_RDI + 0x20);
  std::__cxx11::string::~string(local_e8);
  return pMVar12;
}

Assistant:

Mesh* MSMSFormat::ReadShape() {
    char inbuf[MSMSLINESIZE];
    std::string line;

    vertFile_->clear();
    vertFile_->seekg(0);

    while (vertFile_->getline(inbuf, MSMSLINESIZE)) {
      // ignore comment lines:
      if (inbuf[0] != '#') {
        line = inbuf;
        StringTokenizer tokenizer(line);
        // do we have at least 3 tokens on this vertex line?
        if (tokenizer.countTokens() >= 3) {
          Vector3d vertex;
          // int l0fa, atomid, l;
          vertex[0] = tokenizer.nextTokenAsDouble();
          vertex[1] = tokenizer.nextTokenAsDouble();
          vertex[2] = tokenizer.nextTokenAsDouble();
          vertices_.push_back(vertex);
        }
        if (tokenizer.countTokens() >= 6) {
          Vector3d normal;
          normal[0] = tokenizer.nextTokenAsDouble();
          normal[1] = tokenizer.nextTokenAsDouble();
          normal[2] = tokenizer.nextTokenAsDouble();
          normals_.push_back(normal);
        }
        // l0fa = tokenizer.nextTokenAsInt();
        // atomid = tokenizer.nextTokenAsInt();
        // l = tokenizer.nextTokenAsInt();
      }
    }

    faceFile_->clear();
    faceFile_->seekg(0);
    while (faceFile_->getline(inbuf, MSMSLINESIZE)) {
      // ignore comment lines:
      if (inbuf[0] != '#') {
        line = inbuf;
        StringTokenizer tokenizer(line);
        // do we have at least 3 tokens on this vertex line?
        if (tokenizer.countTokens() >= 3) {
          int v0, v1, v2;
          // int surftype, ana;
          v0 = tokenizer.nextTokenAsInt();
          v1 = tokenizer.nextTokenAsInt();
          v2 = tokenizer.nextTokenAsInt();
          // surftype = tokenizer.nextTokenAsInt();
          // ana = tokenizer.nextTokenAsInt();
          v0--;  // convert from 1-based indexing to 0-based indexing
          v1--;
          v2--;
          mesh_->add(vertices_[v0], vertices_[v1], vertices_[v2]);
        }
      }
    }
    std::cerr << "MSMS files have " << vertices_.size() << " vertices and ";
    std::cerr << mesh_->size() << " facets\n";
    return mesh_;
  }